

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int pulse_enumerate_devices
              (cubeb_conflict *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  pa_operation *ppVar1;
  void *local_48;
  void *pvStack_40;
  cubeb_device_info *local_38;
  ulong uStack_30;
  cubeb_conflict *local_28;
  
  local_38 = (cubeb_device_info *)0x0;
  uStack_30 = 0;
  local_48 = (void *)0x0;
  pvStack_40 = (void *)0x0;
  local_28 = context;
  (*cubeb_pa_threaded_mainloop_lock)(context->mainloop);
  ppVar1 = (*cubeb_pa_context_get_server_info)(context->context,pulse_server_info_cb,&local_48);
  if (ppVar1 != (pa_operation *)0x0) {
    operation_wait(context,(pa_stream *)0x0,ppVar1);
    (*cubeb_pa_operation_unref)(ppVar1);
  }
  if ((type & CUBEB_DEVICE_TYPE_OUTPUT) != CUBEB_DEVICE_TYPE_UNKNOWN) {
    ppVar1 = (*cubeb_pa_context_get_sink_info_list)(context->context,pulse_sink_info_cb,&local_48);
    if (ppVar1 != (pa_operation *)0x0) {
      operation_wait(context,(pa_stream *)0x0,ppVar1);
      (*cubeb_pa_operation_unref)(ppVar1);
    }
  }
  if ((type & CUBEB_DEVICE_TYPE_INPUT) != CUBEB_DEVICE_TYPE_UNKNOWN) {
    ppVar1 = (*cubeb_pa_context_get_source_info_list)
                       (context->context,pulse_source_info_cb,&local_48);
    if (ppVar1 != (pa_operation *)0x0) {
      operation_wait(context,(pa_stream *)0x0,ppVar1);
      (*cubeb_pa_operation_unref)(ppVar1);
    }
  }
  (*cubeb_pa_threaded_mainloop_unlock)(context->mainloop);
  collection->device = local_38;
  collection->count = uStack_30 >> 0x20;
  free(local_48);
  free(pvStack_40);
  return 0;
}

Assistant:

static int
pulse_enumerate_devices(cubeb * context, cubeb_device_type type,
                        cubeb_device_collection * collection)
{
  pulse_dev_list_data user_data = {NULL, NULL, NULL, 0, 0, context};
  pa_operation * o;

  WRAP(pa_threaded_mainloop_lock)(context->mainloop);

  o = WRAP(pa_context_get_server_info)(context->context, pulse_server_info_cb,
                                       &user_data);
  if (o) {
    operation_wait(context, NULL, o);
    WRAP(pa_operation_unref)(o);
  }

  if (type & CUBEB_DEVICE_TYPE_OUTPUT) {
    o = WRAP(pa_context_get_sink_info_list)(context->context,
                                            pulse_sink_info_cb, &user_data);
    if (o) {
      operation_wait(context, NULL, o);
      WRAP(pa_operation_unref)(o);
    }
  }

  if (type & CUBEB_DEVICE_TYPE_INPUT) {
    o = WRAP(pa_context_get_source_info_list)(context->context,
                                              pulse_source_info_cb, &user_data);
    if (o) {
      operation_wait(context, NULL, o);
      WRAP(pa_operation_unref)(o);
    }
  }

  WRAP(pa_threaded_mainloop_unlock)(context->mainloop);

  collection->device = user_data.devinfo;
  collection->count = user_data.count;

  free(user_data.default_sink_name);
  free(user_data.default_source_name);
  return CUBEB_OK;
}